

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

bool cfd::core::ScriptUtil::IsValidRedeemScript(Script *redeem_script)

{
  size_t sVar1;
  CfdSourceLocation local_60;
  ByteData local_38;
  size_t local_20;
  size_t script_buf_size;
  Script *redeem_script_local;
  
  script_buf_size = (size_t)redeem_script;
  Script::GetData(&local_38,redeem_script);
  sVar1 = ByteData::GetDataSize(&local_38);
  ByteData::~ByteData((ByteData *)0x4016c5);
  if (sVar1 >= 0x209) {
    local_20 = sVar1;
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_script.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x5c5;
    local_60.funcname = "IsValidRedeemScript";
    logger::warn<unsigned_long&>
              (&local_60,"Redeem script size is over the limit. script size={}",&local_20);
  }
  return sVar1 < 0x209;
}

Assistant:

bool ScriptUtil::IsValidRedeemScript(const Script& redeem_script) {
  size_t script_buf_size = redeem_script.GetData().GetDataSize();
  if (script_buf_size > Script::kMaxRedeemScriptSize) {
    warn(
        CFD_LOG_SOURCE, "Redeem script size is over the limit. script size={}",
        script_buf_size);
    return false;
  }
  return true;
}